

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O0

void __thiscall Assimp::LWOImporter::LoadLWO2Clip(LWOImporter *this,uint length)

{
  ushort uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  DeadlyImportError *pDVar4;
  ostream *this_00;
  Logger *pLVar5;
  allocator local_2f1;
  string local_2f0;
  undefined1 local_2ca;
  allocator local_2c9;
  string local_2c8;
  string local_2a8 [36];
  int local_284;
  ostringstream local_280 [8];
  ostringstream ss;
  undefined1 local_108 [8];
  string s;
  int16_t start;
  int16_t offset;
  uint8_t digits;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8;
  SubChunkHeader local_98;
  SubChunkHeader head;
  Clip *clip;
  undefined1 local_4d;
  allocator local_39;
  string local_38;
  uint local_14;
  LWOImporter *pLStack_10;
  uint length_local;
  LWOImporter *this_local;
  
  local_14 = length;
  pLStack_10 = this;
  if (length < 10) {
    local_4d = 1;
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"LWO: CLIP chunk is too small",&local_39);
    DeadlyImportError::DeadlyImportError(pDVar4,&local_38);
    local_4d = 0;
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  LWO::Clip::Clip((Clip *)&clip);
  std::vector<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>::push_back
            (&this->mClips,(Clip *)&clip);
  LWO::Clip::~Clip((Clip *)&clip);
  head = (SubChunkHeader)
         std::vector<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>::back(&this->mClips);
  uVar3 = GetU4(this);
  *(uint32_t *)((long)head + 0x2c) = uVar3;
  local_98 = IFF::LoadSubChunk(&this->mFileBuffer);
  if (local_98.type == 0x414e494d) {
    pLVar5 = DefaultLogger::get();
    Logger::warn(pLVar5,"LWO2: Animated textures are not supported");
  }
  else if (local_98.type == 0x49534551) {
    if (local_98.length < 0x10) {
      s.field_2._M_local_buf[0xe] = '\x01';
      pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&start,"LWO: ISEQ chunk is too small",
                 (allocator *)(s.field_2._M_local_buf + 0xf));
      DeadlyImportError::DeadlyImportError(pDVar4,(string *)&start);
      s.field_2._M_local_buf[0xe] = '\0';
      __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    s.field_2._M_local_buf[0xd] = GetU1(this);
    this->mFileBuffer = this->mFileBuffer + 1;
    s.field_2._10_2_ = GetU2(this);
    this->mFileBuffer = this->mFileBuffer + 4;
    s.field_2._8_2_ = GetU2(this);
    this->mFileBuffer = this->mFileBuffer + 4;
    std::__cxx11::string::string((string *)local_108);
    std::__cxx11::ostringstream::ostringstream(local_280);
    GetS0(this,(string *)local_108,(uint)local_98.length);
    uVar1 = std::__cxx11::string::length();
    local_98.length = ~uVar1 + local_98.length;
    std::operator<<((ostream *)local_280,(string *)local_108);
    local_284 = (int)std::setw((uint)(byte)s.field_2._M_local_buf[0xd]);
    this_00 = std::operator<<((ostream *)local_280,(_Setw)local_284);
    std::ostream::operator<<(this_00,(int)(short)s.field_2._10_2_ + (int)(short)s.field_2._8_2_);
    GetS0(this,(string *)local_108,(uint)local_98.length);
    std::operator<<((ostream *)local_280,(string *)local_108);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)((long)head + 8),local_2a8);
    std::__cxx11::string::~string(local_2a8);
    *(undefined4 *)head = 1;
    std::__cxx11::ostringstream::~ostringstream(local_280);
    std::__cxx11::string::~string((string *)local_108);
  }
  else if (local_98.type == 0x4e454741) {
    if (local_98.length < 2) {
      pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2f0,"LWO: NEGA chunk is too small",&local_2f1);
      DeadlyImportError::DeadlyImportError(pDVar4,&local_2f0);
      __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    uVar2 = GetU2(this);
    *(bool *)((long)head + 0x30) = uVar2 != 0;
  }
  else if (local_98.type == 0x53544343) {
    pLVar5 = DefaultLogger::get();
    Logger::warn(pLVar5,"LWO2: Color shifted images are not supported");
  }
  else if (local_98.type == 0x5354494c) {
    if (local_98.length == 0) {
      local_ba = 1;
      pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b8,"LWO: STIL chunk is too small",&local_b9);
      DeadlyImportError::DeadlyImportError(pDVar4,&local_b8);
      local_ba = 0;
      __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    GetS0(this,(string *)((long)head + 8),(uint)local_98.length);
    *(undefined4 *)head = 0;
  }
  else if (local_98.type == 0x58524546) {
    if (local_98.length < 4) {
      local_2ca = 1;
      pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2c8,"LWO: XREF chunk is too small",&local_2c9);
      DeadlyImportError::DeadlyImportError(pDVar4,&local_2c8);
      local_2ca = 0;
      __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    *(undefined4 *)head = 2;
    uVar3 = GetU4(this);
    *(uint32_t *)((long)head + 0x28) = uVar3;
  }
  else {
    pLVar5 = DefaultLogger::get();
    Logger::warn(pLVar5,"LWO2: Encountered unknown CLIP sub-chunk");
  }
  return;
}

Assistant:

void LWOImporter::LoadLWO2Clip(unsigned int length)
{
    AI_LWO_VALIDATE_CHUNK_LENGTH(length,CLIP,10);

    mClips.push_back(LWO::Clip());
    LWO::Clip& clip = mClips.back();

    // first - get the index of the clip
    clip.idx = GetU4();

    IFF::SubChunkHeader head = IFF::LoadSubChunk(mFileBuffer);
    switch (head.type)
    {
    case AI_LWO_STIL:
        AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,STIL,1);

        // "Normal" texture
        GetS0(clip.path,head.length);
        clip.type = Clip::STILL;
        break;

    case AI_LWO_ISEQ:
        AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,ISEQ,16);
        // Image sequence. We'll later take the first.
        {
            uint8_t digits = GetU1();  mFileBuffer++;
            int16_t offset = GetU2();  mFileBuffer+=4;
            int16_t start  = GetU2();  mFileBuffer+=4;

            std::string s;
            std::ostringstream ss;
            GetS0(s,head.length);

            head.length -= (uint16_t)s.length()+1;
            ss << s;
            ss << std::setw(digits) << offset + start;
            GetS0(s,head.length);
            ss << s;
            clip.path = ss.str();
            clip.type = Clip::SEQ;
        }
        break;

    case AI_LWO_STCC:
        ASSIMP_LOG_WARN("LWO2: Color shifted images are not supported");
        break;

    case AI_LWO_ANIM:
        ASSIMP_LOG_WARN("LWO2: Animated textures are not supported");
        break;

    case AI_LWO_XREF:
        AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,XREF,4);

        // Just a cross-reference to another CLIp
        clip.type = Clip::REF;
        clip.clipRef = GetU4();
        break;

    case AI_LWO_NEGA:
        AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,NEGA,2);
        clip.negate = (0 != GetU2());
        break;

    default:
        ASSIMP_LOG_WARN("LWO2: Encountered unknown CLIP sub-chunk");
    }
}